

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::Server::write_response_core
          (Server *this,Stream *strm,bool close_connection,Request *req,Response *res,
          bool need_apply_ranges)

{
  Headers *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  _Manager_type p_Var4;
  pointer pcVar5;
  undefined1 *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  HandlerResponse HVar10;
  int iVar11;
  ostream *poVar12;
  _Alloc_hider _Var13;
  char *pcVar14;
  const_iterator cVar15;
  char *pcVar16;
  ssize_t sVar17;
  long lVar18;
  int extraout_var;
  int extraout_var_00;
  ulong uVar19;
  ulong uVar20;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar21;
  string boundary;
  string content_type;
  stringstream ss;
  key_type local_258;
  Server *local_238;
  Request *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 local_190;
  ios_base local_138 [264];
  
  local_230 = req;
  if ((res->status < 400) ||
     ((this->error_handler_).super__Function_base._M_manager == (_Manager_type)0x0)) {
    local_220 = &local_1d8.field_2;
    local_1d8._M_string_length = 0;
    local_1d8.field_2._M_local_buf[0] = '\0';
    local_228 = &local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    local_1f8._M_dataplus._M_p = (pointer)local_228;
    local_1d8._M_dataplus._M_p = (pointer)local_220;
    if (need_apply_ranges) goto LAB_001387c1;
  }
  else {
    HVar10 = (*(this->error_handler_)._M_invoker)((_Any_data *)&this->error_handler_,req,res);
    local_220 = &local_1d8.field_2;
    local_1d8._M_string_length = 0;
    local_1d8.field_2._M_local_buf[0] = '\0';
    local_228 = &local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    local_1f8._M_dataplus._M_p = (pointer)local_228;
    local_1d8._M_dataplus._M_p = (pointer)local_220;
    if (HVar10 == Handled || need_apply_ranges) {
LAB_001387c1:
      local_220 = &local_1d8.field_2;
      local_228 = &local_1f8.field_2;
      local_1d8.field_2._M_local_buf[0] = '\0';
      local_1d8._M_string_length = 0;
      local_1f8.field_2._M_local_buf[0] = '\0';
      local_1f8._M_string_length = 0;
      local_1f8._M_dataplus._M_p = (pointer)local_228;
      local_1d8._M_dataplus._M_p = (pointer)local_220;
      apply_ranges(this,local_230,res,&local_1d8,&local_1f8);
    }
  }
  local_238 = this;
  if (close_connection) {
LAB_001389ca:
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Connection","");
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"close","");
    cVar3 = *(char *)local_1b8._0_8_;
    pcVar14 = (char *)local_1b8._0_8_;
    while (cVar3 != '\0') {
      pcVar14 = pcVar14 + 1;
      if ((cVar3 == '\n') || (cVar3 == '\r')) goto LAB_00138a6e;
      cVar3 = *pcVar14;
    }
    cVar3 = *local_258._M_dataplus._M_p;
    _Var13._M_p = local_258._M_dataplus._M_p;
    while (cVar3 != '\0') {
      _Var13._M_p = _Var13._M_p + 1;
      if ((cVar3 == '\n') || (cVar3 == '\r')) goto LAB_00138a6e;
      cVar3 = *_Var13._M_p;
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&res->headers,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
               &local_258);
LAB_00138a6e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    this = local_238;
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
  }
  else {
    paVar2 = &local_258.field_2;
    local_258._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Connection","");
    pVar21 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::equal_range(&(local_230->headers)._M_t,&local_258);
    if (pVar21.first._M_node._M_node == pVar21.second._M_node._M_node) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)(pVar21.first._M_node._M_node + 2);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,pcVar14,(allocator<char> *)&local_218);
    iVar11 = std::__cxx11::string::compare(local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if (iVar11 == 0) goto LAB_001389ca;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"timeout=",8);
    poVar12 = std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,", max=",6);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    local_258._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Keep-Alive","");
    std::__cxx11::stringbuf::str();
    cVar3 = *local_258._M_dataplus._M_p;
    _Var13._M_p = local_258._M_dataplus._M_p;
    while (cVar3 != '\0') {
      _Var13._M_p = _Var13._M_p + 1;
      if ((cVar3 == '\n') || (cVar3 == '\r')) goto LAB_00138973;
      cVar3 = *_Var13._M_p;
    }
    cVar3 = *local_218._M_dataplus._M_p;
    _Var13._M_p = local_218._M_dataplus._M_p;
    while (cVar3 != '\0') {
      _Var13._M_p = _Var13._M_p + 1;
      if ((cVar3 == '\n') || (cVar3 == '\r')) goto LAB_00138973;
      cVar3 = *_Var13._M_p;
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&res->headers,&local_258,&local_218);
LAB_00138973:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  pcVar14 = local_1b8 + 0x10;
  local_1b8._0_8_ = pcVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Content-Type","");
  this_00 = &res->headers;
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this_00->_M_t,(key_type *)local_1b8);
  p_Var1 = &(res->headers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar15._M_node == p_Var1) {
    if (res->content_length_ != 0 || (res->body)._M_string_length != 0) {
      if ((char *)local_1b8._0_8_ != pcVar14) {
        operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
      }
LAB_00138b66:
      local_1b8._0_8_ = pcVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Content-Type","");
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"text/plain","");
      cVar3 = *(char *)local_1b8._0_8_;
      pcVar16 = (char *)local_1b8._0_8_;
      while (cVar3 != '\0') {
        pcVar16 = pcVar16 + 1;
        if ((cVar3 == '\n') || (cVar3 == '\r')) goto LAB_00138c00;
        cVar3 = *pcVar16;
      }
      cVar3 = *local_258._M_dataplus._M_p;
      _Var13._M_p = local_258._M_dataplus._M_p;
      while (cVar3 != '\0') {
        _Var13._M_p = _Var13._M_p + 1;
        if ((cVar3 == '\n') || (cVar3 == '\r')) goto LAB_00138c00;
        cVar3 = *_Var13._M_p;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &local_258);
LAB_00138c00:
      this = local_238;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        this = local_238;
      }
      goto joined_r0x00138c26;
    }
    p_Var4 = (res->content_provider_).super__Function_base._M_manager;
    if ((char *)local_1b8._0_8_ != pcVar14) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
    this = local_238;
    if (p_Var4 != (_Manager_type)0x0) goto LAB_00138b66;
  }
  else {
joined_r0x00138c26:
    if ((char *)local_1b8._0_8_ != pcVar14) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
  }
  local_1b8._0_8_ = pcVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Content-Length","");
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this_00->_M_t,(key_type *)local_1b8);
  if (((_Rb_tree_header *)cVar15._M_node == p_Var1) &&
     (res->content_length_ == 0 && (res->body)._M_string_length == 0)) {
    p_Var4 = (res->content_provider_).super__Function_base._M_manager;
    if ((char *)local_1b8._0_8_ != pcVar14) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
    this = local_238;
    if (p_Var4 == (_Manager_type)0x0) {
      local_1b8._0_8_ = pcVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Content-Length","");
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"0","");
      cVar3 = *(char *)local_1b8._0_8_;
      pcVar16 = (char *)local_1b8._0_8_;
      while (cVar3 != '\0') {
        pcVar16 = pcVar16 + 1;
        if ((cVar3 == '\n') || (cVar3 == '\r')) goto LAB_00138d55;
        cVar3 = *pcVar16;
      }
      cVar3 = *local_258._M_dataplus._M_p;
      _Var13._M_p = local_258._M_dataplus._M_p;
      while (cVar3 != '\0') {
        _Var13._M_p = _Var13._M_p + 1;
        if ((cVar3 == '\n') || (cVar3 == '\r')) goto LAB_00138d55;
        cVar3 = *_Var13._M_p;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &local_258);
LAB_00138d55:
      this = local_238;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        this = local_238;
      }
      goto joined_r0x00138d8a;
    }
  }
  else {
joined_r0x00138d8a:
    if ((char *)local_1b8._0_8_ != pcVar14) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
  }
  local_1b8._0_8_ = pcVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Accept-Ranges","");
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this_00->_M_t,(key_type *)local_1b8);
  if ((_Rb_tree_header *)cVar15._M_node == p_Var1) {
    iVar11 = std::__cxx11::string::compare((char *)local_230);
    if ((char *)local_1b8._0_8_ != pcVar14) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
    if (iVar11 == 0) {
      local_1b8._0_8_ = pcVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Accept-Ranges","");
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"bytes","");
      cVar3 = *(char *)local_1b8._0_8_;
      pcVar16 = (char *)local_1b8._0_8_;
      while (cVar3 != '\0') {
        pcVar16 = pcVar16 + 1;
        if ((cVar3 == '\n') || (cVar3 == '\r')) goto LAB_0013905a;
        cVar3 = *pcVar16;
      }
      cVar3 = *local_258._M_dataplus._M_p;
      _Var13._M_p = local_258._M_dataplus._M_p;
      while (cVar3 != '\0') {
        _Var13._M_p = _Var13._M_p + 1;
        if ((cVar3 == '\n') || (cVar3 == '\r')) goto LAB_0013905a;
        cVar3 = *_Var13._M_p;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &local_258);
LAB_0013905a:
      this = local_238;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        this = local_238;
      }
      goto joined_r0x00139080;
    }
  }
  else {
joined_r0x00139080:
    if ((char *)local_1b8._0_8_ != pcVar14) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
  }
  if ((this->post_routing_handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->post_routing_handler_)._M_invoker)
              ((_Any_data *)&this->post_routing_handler_,local_230,res);
  }
  puVar6 = local_1b8 + 0x18;
  local_1b8._0_8_ = &PTR__BufferStream_001bf400;
  local_1a8._M_allocated_capacity = 0;
  local_1a8._M_local_buf[8] = '\0';
  local_190 = 0;
  local_1b8._8_8_ = puVar6;
  local_258._M_dataplus._M_p = status_message(res->status);
  sVar17 = Stream::write_format<int,char_const*>
                     ((Stream *)local_1b8,"HTTP/1.1 %d %s\r\n",&res->status,(char **)&local_258);
  if (sVar17 != 0) {
    if ((this->header_writer_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    lVar18 = (*(this->header_writer_)._M_invoker)
                       ((_Any_data *)&this->header_writer_,(Stream *)local_1b8,this_00);
    uVar8 = local_1a8._M_allocated_capacity;
    uVar7 = local_1b8._8_8_;
    if (lVar18 != 0) {
      uVar19 = 0;
      do {
        if ((ulong)uVar8 <= uVar19) break;
        iVar11 = (*strm->_vptr_Stream[5])(strm,(undefined1 *)(uVar7 + uVar19));
        uVar19 = uVar19 + CONCAT44(extraout_var,iVar11);
      } while (-1 < extraout_var);
      local_1b8._0_8_ = &PTR__BufferStream_001bf400;
      if ((undefined1 *)local_1b8._8_8_ != puVar6) {
        operator_delete((void *)local_1b8._8_8_,
                        CONCAT71(local_1a8._9_7_,local_1a8._M_local_buf[8]) + 1);
      }
      iVar11 = std::__cxx11::string::compare((char *)local_230);
      bVar9 = true;
      if (iVar11 != 0) {
        uVar19 = (res->body)._M_string_length;
        if (uVar19 == 0) {
          if ((res->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0) {
            bVar9 = write_content_with_provider(local_238,strm,local_230,res,&local_1f8,&local_1d8);
            res->content_provider_success_ = bVar9;
          }
        }
        else {
          pcVar5 = (res->body)._M_dataplus._M_p;
          uVar20 = 0;
          do {
            bVar9 = uVar19 <= uVar20;
            if (uVar19 <= uVar20) break;
            iVar11 = (*strm->_vptr_Stream[5])(strm,pcVar5 + uVar20);
            uVar20 = uVar20 + CONCAT44(extraout_var_00,iVar11);
          } while (-1 < extraout_var_00);
        }
      }
      if ((local_238->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(local_238->logger_)._M_invoker)((_Any_data *)&local_238->logger_,local_230,res);
      }
      goto LAB_001390e3;
    }
  }
  local_1b8._0_8_ = &PTR__BufferStream_001bf400;
  if ((undefined1 *)local_1b8._8_8_ != puVar6) {
    operator_delete((void *)local_1b8._8_8_,CONCAT71(local_1a8._9_7_,local_1a8._M_local_buf[8]) + 1)
    ;
  }
  bVar9 = false;
LAB_001390e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != local_228) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                             local_1f8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != local_220) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  return bVar9;
}

Assistant:

inline bool Server::write_response_core(Stream &strm, bool close_connection,
                                        const Request &req, Response &res,
                                        bool need_apply_ranges) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_ &&
      error_handler_(req, res) == HandlerResponse::Handled) {
    need_apply_ranges = true;
  }

  std::string content_type;
  std::string boundary;
  if (need_apply_ranges) { apply_ranges(req, res, content_type, boundary); }

  // Prepare additional headers
  if (close_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  } else {
    std::stringstream ss;
    ss << "timeout=" << keep_alive_timeout_sec_
       << ", max=" << keep_alive_max_count_;
    res.set_header("Keep-Alive", ss.str());
  }

  if (!res.has_header("Content-Type") &&
      (!res.body.empty() || res.content_length_ > 0 || res.content_provider_)) {
    res.set_header("Content-Type", "text/plain");
  }

  if (!res.has_header("Content-Length") && res.body.empty() &&
      !res.content_length_ && !res.content_provider_) {
    res.set_header("Content-Length", "0");
  }

  if (!res.has_header("Accept-Ranges") && req.method == "HEAD") {
    res.set_header("Accept-Ranges", "bytes");
  }

  if (post_routing_handler_) { post_routing_handler_(req, res); }

  // Response line and headers
  {
    detail::BufferStream bstrm;

    if (!bstrm.write_format("HTTP/1.1 %d %s\r\n", res.status,
                            status_message(res.status))) {
      return false;
    }

    if (!header_writer_(bstrm, res.headers)) { return false; }

    // Flush buffer
    auto &data = bstrm.get_buffer();
    detail::write_data(strm, data.data(), data.size());
  }

  // Body
  auto ret = true;
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!detail::write_data(strm, res.body.data(), res.body.size())) {
        ret = false;
      }
    } else if (res.content_provider_) {
      if (write_content_with_provider(strm, req, res, boundary, content_type)) {
        res.content_provider_success_ = true;
      } else {
        res.content_provider_success_ = false;
        ret = false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return ret;
}